

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre.h
# Opt level: O0

ParseResult * __thiscall
trivialre::re_compiler::
C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
::CompileCharSet_abi_cxx11_
          (ParseResult *__return_storage_ptr__,
          C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
          *this,string_view str)

{
  string_view at;
  string_view str_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  function<bool_(char)> *pred_00;
  bool bVar4;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  function<bool_(char)> local_138;
  Matcher local_118;
  function<bool_(char)> local_f8;
  anon_class_1_1_f07a6c82 local_d5;
  undefined4 local_d4;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  C<StringTestingBuilder,_Policy> *local_a8;
  size_t sStack_a0;
  string_view local_98;
  C<StringTestingBuilder,_Policy> *local_88;
  size_t sStack_80;
  char local_76;
  type local_75;
  char ch;
  type local_62;
  undefined1 local_60 [8];
  FnPred pred;
  bool negated;
  C<StringTestingBuilder,_Policy> *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  pred._M_invoker = (_Invoker_type)str._M_len;
  this_local = (C<StringTestingBuilder,_Policy> *)pred._M_invoker;
  str_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = C<StringTestingBuilder,_Policy>::IsCharAt
                    ((C<StringTestingBuilder,_Policy> *)this,str,0,'^');
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
  }
  std::function<bool_(char)>::function((function<bool_(char)> *)local_60);
  while( true ) {
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    bVar4 = false;
    if (sVar2 != 0) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0);
      bVar4 = *pvVar3 != ']';
    }
    if (!bVar4) break;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (((sVar2 < 3) ||
        (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1),
        *pvVar3 != '-')) ||
       (pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,2),
       *pvVar3 == ']')) {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0);
      local_75.ch = *pvVar3;
      if (local_75.ch == '\\') {
        sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
        if (sVar2 == 1) break;
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
        pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0);
        local_75.ch = *pvVar3;
      }
      local_76 = local_75.ch;
      AddPred<trivialre::re_compiler::C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>::CompileCharSet[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::_lambda(char)_2_>
                (this,(FnPred *)local_60,local_75);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
    }
    else {
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,0);
      local_62.a = *pvVar3;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,2);
      local_62.b = *pvVar3;
      AddPred<trivialre::re_compiler::C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>::CompileCharSet[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::_lambda(char)_1_>
                (this,(FnPred *)local_60,local_62);
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,3);
    }
  }
  local_88 = this_local;
  sStack_80 = str_local._M_len;
  str_00._M_str = (char *)str_local._M_len;
  str_00._M_len = (size_t)this_local;
  bVar4 = C<StringTestingBuilder,_Policy>::IsCharAt
                    ((C<StringTestingBuilder,_Policy> *)this,str_00,0,']');
  if (bVar4) {
    bVar4 = std::function::operator_cast_to_bool((function *)local_60);
    if (bVar4) {
      if (bVar1) {
        std::function<bool_(char)>::function(&local_f8,(function<bool_(char)> *)local_60);
        std::function<bool(char)>::operator=
                  ((function<bool(char)> *)local_60,(anon_class_32_1_89904f1f *)&local_f8);
        CompileCharSet[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)::
        {lambda(char)#4}::~CompileCharSet((_lambda_char__4_ *)&local_f8);
      }
    }
    else {
      local_d5.negated = bVar1;
      std::function<bool(char)>::operator=((function<bool(char)> *)local_60,&local_d5);
    }
    std::function<bool_(char)>::function(&local_138,(function<bool_(char)> *)local_60);
    StringTestingBuilder::CharP<std::function<bool(char)>>
              (&local_118,(StringTestingBuilder *)&local_138,pred_00);
    local_148 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1,
                           0xffffffffffffffff);
    std::
    pair<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,&local_118,&local_148);
    std::__cxx11::string::~string((string *)&local_118);
    std::function<bool_(char)>::~function(&local_138);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"failed to spot ] at the end of char-set term");
    local_a8 = this_local;
    sStack_a0 = str_local._M_len;
    at._M_str = (char *)str_local._M_len;
    at._M_len = (size_t)this_local;
    CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy::NoteError(std::
    basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::
    char_traits<char>_>_(this,local_98,at);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_d0);
    std::
    pair<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::pair<const_char_(&)[1],_true>(__return_storage_ptr__,&local_d0,(char (*) [1])0x179cad);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_d0);
  }
  local_d4 = 1;
  std::function<bool_(char)>::~function((function<bool_(char)> *)local_60);
  return __return_storage_ptr__;
}

Assistant:

ParseResult CompileCharSet(std::string_view str) {
    bool negated = false;
    if (IsCharAt(str, 0, '^')) {
      negated = true;
      str.remove_prefix(1);
    }
    FnPred pred;

    while (str.size() > 0 && str[0] != ']') {
      if (str.size() > 2 && str[1] == '-' && str[2] != ']') {
        // range
        AddPred(&pred, [a = str[0], b = str[2]](char ch) { return a <= ch && ch <= b; });
        str.remove_prefix(3);
        continue;
      }

      char ch = str[0];

      if (ch == '\\') {
        if (str.size() == 1) {
          break;
        }
        str.remove_prefix(1);
        ch = str[0];
      }

      AddPred(&pred, [ch](char candidate) { return ch == candidate; });

      str.remove_prefix(1);
    }

    if (!IsCharAt(str, 0, ']')) {
      ErrorPolicy::NoteError("failed to spot ] at the end of char-set term", str);
      return {{}, ""};
    }

    if (!pred) {
      pred = [negated](char candidate) { return negated; };
    } else if (negated) {
      pred = [pred = std::move(pred)](char candidate) { return !pred(candidate); };
    }
    return {builder.CharP(std::move(pred)), str.substr(1)};
  }